

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::Detail::
rangeToString<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (string *__return_storage_ptr__,Detail *this,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          first,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                last)

{
  string *str;
  ReusableStringStream rss;
  ReusableStringStream local_60;
  string local_48;
  
  ReusableStringStream::ReusableStringStream(&local_60);
  std::operator<<((ostream *)local_60.m_oss,"{ ");
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this != first._M_current)
  {
    StringMaker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::convert(&local_48,(string *)this);
    std::operator<<((ostream *)local_60.m_oss,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    for (str = (string *)(this + 0x20); str != first._M_current; str = str + 1) {
      std::operator<<((ostream *)local_60.m_oss,", ");
      StringMaker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
      ::convert(&local_48,str);
      std::operator<<((ostream *)local_60.m_oss,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
  }
  std::operator<<((ostream *)local_60.m_oss," }");
  ReusableStringStream::str_abi_cxx11_((string *)__return_storage_ptr__,&local_60);
  ReusableStringStream::~ReusableStringStream(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string rangeToString(InputIterator first, Sentinel last) {
            ReusableStringStream rss;
            rss << "{ ";
            if (first != last) {
                rss << ::Catch::Detail::stringify(*first);
                for (++first; first != last; ++first)
                    rss << ", " << ::Catch::Detail::stringify(*first);
            }
            rss << " }";
            return rss.str();
        }